

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::GLFrameBuffer
          (GLFrameBuffer *this,uint sizeX_,uint sizeY_,bool isDefault)

{
  undefined3 in_register_00000009;
  
  FrameBuffer::FrameBuffer(&this->super_FrameBuffer);
  (this->super_FrameBuffer)._vptr_FrameBuffer = (_func_int **)&PTR__GLFrameBuffer_004b7fd0;
  (this->super_FrameBuffer).sizeX = sizeX_;
  (this->super_FrameBuffer).sizeY = sizeY_;
  if (CONCAT31(in_register_00000009,isDefault) == 0) {
    (*glad_glGenFramebuffers)(1,&this->handle);
    (*glad_glBindFramebuffer)(0x8d40,this->handle);
  }
  else {
    this->handle = 0;
  }
  checkGLError(true);
  return;
}

Assistant:

GLFrameBuffer::GLFrameBuffer(unsigned int sizeX_, unsigned int sizeY_, bool isDefault) {
  sizeX = sizeX_;
  sizeY = sizeY_;
  if (isDefault) {
    handle = 0;
  } else {
    glGenFramebuffers(1, &handle);
    glBindFramebuffer(GL_FRAMEBUFFER, handle);
  }
  checkGLError();
}